

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O0

void shuff_calculate_minimum_redundancy(uint64_t *freq,uint64_t *syms,int64_t n)

{
  bool bVar1;
  uint64_t dpth;
  int64_t used;
  int64_t avbl;
  int64_t next;
  int64_t leaf;
  int64_t root;
  int64_t n_local;
  uint64_t *syms_local;
  uint64_t *freq_local;
  
  if (n != 0) {
    if (n == 1) {
      freq[*syms] = 0;
    }
    else {
      freq[*syms] = freq[syms[1]] + freq[*syms];
      root = 0;
      leaf = 2;
      for (next = 1; next < n + -1; next = next + 1) {
        if ((leaf < n) && (freq[syms[leaf]] <= freq[syms[root]])) {
          freq[syms[next]] = freq[syms[leaf]];
          leaf = leaf + 1;
        }
        else {
          freq[syms[next]] = freq[syms[root]];
          freq[syms[root]] = next;
          root = root + 1;
        }
        if ((leaf < n) && ((next <= root || (freq[syms[leaf]] <= freq[syms[root]])))) {
          freq[syms[next]] = freq[syms[leaf]] + freq[syms[next]];
          leaf = leaf + 1;
        }
        else {
          freq[syms[next]] = freq[syms[root]] + freq[syms[next]];
          freq[syms[root]] = next;
          root = root + 1;
        }
      }
      freq[syms[n + -2]] = 0;
      for (next = n + -3; -1 < next; next = next + -1) {
        freq[syms[next]] = freq[syms[freq[syms[next]]]] + 1;
      }
      dpth = 0;
      root = n + -2;
      next = n + -1;
      avbl = 1;
      while (used = 0, 0 < avbl) {
        while( true ) {
          bVar1 = false;
          if (-1 < root) {
            bVar1 = freq[syms[root]] == dpth;
          }
          if (!bVar1) break;
          used = used + 1;
          root = root + -1;
        }
        for (; used < avbl; avbl = avbl + -1) {
          freq[syms[next]] = dpth;
          next = next + -1;
        }
        dpth = dpth + 1;
        avbl = used << 1;
      }
    }
  }
  return;
}

Assistant:

void shuff_calculate_minimum_redundancy(
    uint64_t freq[], uint64_t syms[], int64_t n)
{
    int64_t root; /* next root node to be used */
    int64_t leaf; /* next leaf to be used */
    int64_t next; /* next value to be assigned */
    int64_t avbl; /* number of available nodes */
    int64_t used; /* number of internal nodes */
    uint64_t dpth; /* current depth of leaves */

    /* check for pathological cases */
    if (n == 0) {
        return;
    }
    if (n == 1) {
        freq[syms[0]] = 0;
        return;
    }

    /* first pass, left to right, setting parent pointers */
    freq[syms[0]] += freq[syms[1]];
    root = 0;
    leaf = 2;
    for (next = 1; next < n - 1; next++) {
        /* select first item for a pairing */
        if (leaf >= n || freq[syms[root]] < freq[syms[leaf]]) {
            freq[syms[next]] = freq[syms[root]];
            freq[syms[root++]] = next;
        } else
            freq[syms[next]] = freq[syms[leaf++]];

        /* add on the second item */
        if (leaf >= n || (root < next && freq[syms[root]] < freq[syms[leaf]])) {
            freq[syms[next]] += freq[syms[root]];
            freq[syms[root++]] = next;
        } else
            freq[syms[next]] += freq[syms[leaf++]];
    }

    /* second pass, right to left, setting internal depths */
    freq[syms[n - 2]] = 0;
    for (next = n - 3; next >= 0; next--)
        freq[syms[next]] = freq[syms[freq[syms[next]]]] + 1;

    /* third pass, right to left, setting leaf depths */
    avbl = 1;
    used = dpth = 0;
    root = n - 2;
    next = n - 1;
    while (avbl > 0) {
        while (root >= 0 && freq[syms[root]] == dpth) {
            used++;
            root--;
        }
        while (avbl > used) {
            freq[syms[next--]] = dpth;
            avbl--;
        }
        avbl = 2 * used;
        dpth++;
        used = 0;
    }
}